

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkClearance.cpp
# Opt level: O1

Vector * __thiscall
chrono::ChLinkClearance::Get_contact_P_abs(Vector *__return_storage_ptr__,ChLinkClearance *this)

{
  ChMarker *pCVar1;
  ChVector<double> *result;
  double dVar2;
  Vector local_38;
  
  pCVar1 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2;
  if (pCVar1 == (ChMarker *)0x0) {
    __return_storage_ptr__->m_data[0] = VNULL;
    __return_storage_ptr__->m_data[1] = DAT_00b90ac0;
    dVar2 = DAT_00b90ac8;
  }
  else {
    Get_contact_N_abs(&local_38,this);
    dVar2 = this->diameter * 0.5 + this->clearance;
    __return_storage_ptr__->m_data[0] = 0.0;
    __return_storage_ptr__->m_data[1] = 0.0;
    __return_storage_ptr__->m_data[2] = 0.0;
    __return_storage_ptr__->m_data[0] =
         (pCVar1->abs_frame).super_ChFrame<double>.coord.pos.m_data[0] - dVar2 * local_38.m_data[0];
    __return_storage_ptr__->m_data[1] =
         (pCVar1->abs_frame).super_ChFrame<double>.coord.pos.m_data[1] - dVar2 * local_38.m_data[1];
    dVar2 = (pCVar1->abs_frame).super_ChFrame<double>.coord.pos.m_data[2] -
            dVar2 * local_38.m_data[2];
  }
  __return_storage_ptr__->m_data[2] = dVar2;
  return __return_storage_ptr__;
}

Assistant:

Vector ChLinkClearance::Get_contact_P_abs() {
    if (!this->GetMarker2())
        return VNULL;
    return Vadd(this->GetMarker2()->GetAbsCoord().pos,
                Vmul(this->Get_contact_N_abs(), -(this->clearance + this->diameter / 2)));
}